

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
          (CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  Compiler *this_00;
  undefined1 local_40 [44];
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  this_00 = (Compiler *)CONCAT44(in_register_00000034,id);
  local_40._36_4_ = in_EDX;
  unique0x100000aa = this_00;
  this_local = this;
  to_expression_abi_cxx11_((CompilerGLSL *)local_40,id,SUB41(in_EDX,0));
  pSVar3 = Compiler::expression_type(this_00,local_40._36_4_);
  uVar2 = Compiler::get_extended_decoration
                    (this_00,local_40._36_4_,SPIRVCrossDecorationPhysicalTypeID);
  bVar1 = Compiler::has_extended_decoration
                    (this_00,local_40._36_4_,SPIRVCrossDecorationPhysicalTypePacked);
  (*this_00->_vptr_Compiler[0x23])(this,this_00,local_40,pSVar3,(ulong)uVar2,(ulong)bVar1,1);
  ::std::__cxx11::string::~string((string *)local_40);
  return this;
}

Assistant:

string CompilerGLSL::to_unpacked_row_major_matrix_expression(uint32_t id)
{
	return unpack_expression_type(to_expression(id), expression_type(id),
	                              get_extended_decoration(id, SPIRVCrossDecorationPhysicalTypeID),
	                              has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked), true);
}